

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::merge_includes(t_json_generator *this,t_program *program)

{
  t_program *program_00;
  bool bVar1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__x;
  reference pptVar2;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *__x_00;
  reference pptVar3;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> *__x_01;
  reference pptVar4;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *__x_02;
  reference pptVar5;
  vector<t_const_*,_std::allocator<t_const_*>_> *__x_03;
  reference pptVar6;
  vector<t_service_*,_std::allocator<t_service_*>_> *__x_04;
  reference pptVar7;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_150
  ;
  t_service **local_148;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_140
  ;
  iterator sv_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_110;
  iterator c_iter;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_> local_e0;
  iterator o_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_> local_b0;
  iterator td_iter;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_80;
  iterator en_iter;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  t_program *include;
  t_program **local_40;
  __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_> local_38;
  iterator inc_iter;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  t_program *program_local;
  t_json_generator *this_local;
  
  __x = t_program::get_includes(program);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
  __normal_iterator(&local_38);
  local_40 = (t_program **)
             std::vector<t_program_*,_std::allocator<t_program_*>_>::begin
                       ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_iter);
  local_38._M_current = local_40;
  while( true ) {
    include = (t_program *)
              std::vector<t_program_*,_std::allocator<t_program_*>_>::end
                        ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                        *)&include);
    if (!bVar1) break;
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&local_38);
    program_00 = *pptVar2;
    merge_includes(this,program_00);
    __x_00 = t_program::get_enums(program_00);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter,__x_00);
    __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
    __normal_iterator(&local_80);
    local_80._M_current =
         (t_enum **)
         std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin
                   ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
    while( true ) {
      typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end
                              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_80,
                         (__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                          *)&typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar3 = __gnu_cxx::
                __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
                operator*(&local_80);
      t_program::add_enum(program,*pptVar3);
      __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
      operator++(&local_80);
    }
    __x_01 = t_program::get_typedefs(program_00);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter,__x_01);
    __gnu_cxx::
    __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
    __normal_iterator(&local_b0);
    local_b0._M_current =
         (t_typedef **)
         std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::begin
                   ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
    while( true ) {
      objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::end
                              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                          *)&objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                ::operator*(&local_b0);
      t_program::add_typedef(program,*pptVar4);
      __gnu_cxx::
      __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
      operator++(&local_b0);
    }
    __x_02 = t_program::get_objects(program_00);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter,__x_02);
    __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
    ::__normal_iterator(&local_e0);
    local_e0._M_current =
         (t_struct **)
         std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin
                   ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    while( true ) {
      consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end
                              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                          *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                ::operator*(&local_e0);
      t_program::add_struct(program,*pptVar5);
      __gnu_cxx::
      __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
      operator++(&local_e0);
    }
    __x_03 = t_program::get_consts(program_00);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter,__x_03);
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    __normal_iterator(&local_110);
    local_110._M_current =
         (t_const **)
         std::vector<t_const_*,_std::allocator<t_const_*>_>::begin
                   ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter);
    while( true ) {
      services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_const_*,_std::allocator<t_const_*>_>::end
                              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_110,
                         (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                          *)&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_110);
      t_program::add_const(program,*pptVar6);
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&local_110);
    }
    __x_04 = t_program::get_services(program_00);
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter,__x_04);
    __gnu_cxx::
    __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    __normal_iterator(&local_140);
    local_148 = (t_service **)
                std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                          ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    local_140._M_current = local_148;
    while( true ) {
      local_150._M_current =
           (t_service **)
           std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                     ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
      bVar1 = __gnu_cxx::operator!=(&local_140,&local_150);
      if (!bVar1) break;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                ::operator*(&local_140);
      t_program::add_service(program,*pptVar7);
      __gnu_cxx::
      __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
      operator++(&local_140);
    }
    std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&c_iter);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::~vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::~vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::~vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
    __gnu_cxx::
    __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&local_38);
  }
  std::vector<t_program_*,_std::allocator<t_program_*>_>::~vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)&inc_iter);
  return;
}

Assistant:

void t_json_generator::merge_includes(t_program* program) {
  vector<t_program*> includes = program->get_includes();
  vector<t_program*>::iterator inc_iter;
  for (inc_iter = includes.begin(); inc_iter != includes.end(); ++inc_iter) {
    t_program* include = *inc_iter;
    // recurse in case we get crazy
    merge_includes(include);
    // merge enums
    vector<t_enum*> enums = include->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      program->add_enum(*en_iter);
    }
    // merge typedefs
    vector<t_typedef*> typedefs = include->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      program->add_typedef(*td_iter);
    }
    // merge structs
    vector<t_struct*> objects = include->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      program->add_struct(*o_iter);
    }
    // merge constants
    vector<t_const*> consts = include->get_consts();
    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      program->add_const(*c_iter);
    }

    // merge services
    vector<t_service*> services = include->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      program->add_service(*sv_iter);
    }
  }
}